

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzshapetriang.cpp
# Opt level: O2

void pzshape::TPZShapeTriang::ShapeInternal
               (int side,TPZVec<double> *x,int order,TPZFMatrix<double> *phi,
               TPZFMatrix<double> *dphi)

{
  ostream *poVar1;
  
  if (side - 7U < 0xfffffffc) {
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Shape/pzshapetriang.cpp"
               ,0x164);
  }
  if (side - 3U < 3) {
    TPZShapeLinear::ShapeInternal(x,order,phi,dphi);
    return;
  }
  if (side == 6) {
    ShapeInternal(x,order,phi,dphi);
    return;
  }
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "static void pzshape::TPZShapeTriang::ShapeInternal(int, TPZVec<REAL> &, int, TPZFMatrix<REAL> &, TPZFMatrix<REAL> &)"
                          );
  poVar1 = std::operator<<(poVar1," Wrong side parameter side ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,side);
  std::endl<char,std::char_traits<char>>(poVar1);
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Shape/pzshapetriang.cpp"
             ,0x178);
}

Assistant:

void TPZShapeTriang::ShapeInternal(int side, TPZVec<REAL> &x, int order,
                                     TPZFMatrix<REAL> &phi, TPZFMatrix<REAL> &dphi) {
        if (side < 3 || side > 6) {
            DebugStop();
        }
        
        switch (side) {
                
            case 3:
            case 4:
            case 5:
            {
                pzshape::TPZShapeLinear::ShapeInternal(x, order, phi, dphi);
            }
                break;
            case 6:
            {
                
                ShapeInternal(x, order, phi, dphi);
            }
                break;
            default:
                std::cout << __PRETTY_FUNCTION__ << " Wrong side parameter side " << side << std::endl;
                DebugStop();
                break;
        }
      
        
        
    }